

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::UninterpretedOption::_InternalParse
          (UninterpretedOption *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  UninterpretedOption_NamePart *msg;
  ulong uVar5;
  char cVar6;
  uint32 res;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Arena *arena;
  string *s;
  ArenaStringPtr *this_00;
  double *p;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  pair<const_char_*,_bool> pVar12;
  
  uVar7 = 0;
LAB_00174d4c:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00175069;
      pVar12 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar12.first;
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00175069;
    }
    bVar1 = *ptr;
    pVar10.second._0_1_ = bVar1;
    pVar10.first = (char *)((long)ptr + 1);
    pVar10._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = *(byte *)((long)ptr + 1);
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar10 = internal::ReadTagFallback(ptr,res);
        if (pVar10.first == (char *)0x0) goto LAB_00175066;
      }
      else {
        pVar10.second = res;
        pVar10.first = (char *)((long)ptr + 2);
        pVar10._12_4_ = 0;
      }
    }
    p = (double *)pVar10.first;
    uVar9 = pVar10.second;
    cVar6 = (char)pVar10.second;
    switch((uint)(pVar10._8_8_ >> 3) & 0x1fffffff) {
    case 2:
      if (cVar6 == '\x12') {
        ptr = (char *)((long)p + -1);
        do {
          pRVar4 = (this->name_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
            iVar8 = (this->name_).super_RepeatedPtrFieldBase.total_size_;
LAB_00174dca:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->name_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar4 = (this->name_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar4->allocated_size;
LAB_00174ddc:
            pRVar4->allocated_size = iVar8 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption_NamePart>
                            ((this->name_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->name_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
            (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar4->elements[iVar8] = msg;
          }
          else {
            iVar3 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar4->allocated_size;
            if (iVar8 <= iVar3) {
              if (iVar8 == (this->name_).super_RepeatedPtrFieldBase.total_size_) goto LAB_00174dca;
              goto LAB_00174ddc;
            }
            (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption_NamePart *)pRVar4->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption_NamePart>
                          (ctx,msg,(char *)((long)ptr + 1));
          if ((double *)ptr == (double *)0x0) goto LAB_00175066;
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x12));
        goto LAB_00174d4c;
      }
      break;
    case 3:
      if (cVar6 != '\x1a') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      arena = (Arena *)(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      s = (this->identifier_value_).ptr_;
      this_00 = &this->identifier_value_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
LAB_00174f92:
        internal::ArenaStringPtr::CreateInstance
                  (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = this_00->ptr_;
      }
LAB_00174fa5:
      ptr = internal::InlineGreedyStringParser(s,(char *)p,ctx);
      goto LAB_00174fdd;
    case 4:
      if (cVar6 == ' ') {
        uVar7 = uVar7 | 8;
        uVar5 = (ulong)(char)*(byte *)p;
        ptr = (char *)((long)p + 1);
        if ((long)uVar5 < 0) {
          uVar9 = ((uint)*(byte *)p + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar11 = internal::VarintParseSlow64((char *)p,uVar9);
            ptr = pVar11.first;
            this->positive_int_value_ = pVar11.second;
            goto LAB_00174fdd;
          }
          uVar5 = (ulong)uVar9;
          ptr = (char *)((long)p + 2);
        }
        this->positive_int_value_ = uVar5;
        goto LAB_00174d4c;
      }
      break;
    case 5:
      if (cVar6 == '(') {
        uVar7 = uVar7 | 0x10;
        uVar5 = (ulong)(char)*(byte *)p;
        ptr = (char *)((long)p + 1);
        if ((long)uVar5 < 0) {
          uVar9 = ((uint)*(byte *)p + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar11 = internal::VarintParseSlow64((char *)p,uVar9);
            ptr = pVar11.first;
            this->negative_int_value_ = pVar11.second;
            goto LAB_00174fdd;
          }
          uVar5 = (ulong)uVar9;
          ptr = (char *)((long)p + 2);
        }
        this->negative_int_value_ = uVar5;
        goto LAB_00174d4c;
      }
      break;
    case 6:
      if (cVar6 == '1') {
        uVar7 = uVar7 | 0x20;
        this->double_value_ = *p;
        ptr = (char *)(p + 1);
        goto LAB_00174d4c;
      }
      break;
    case 7:
      if (cVar6 == ':') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->string_value_).ptr_;
        this_00 = &this->string_value_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_00174f92;
        goto LAB_00174fa5;
      }
      break;
    case 8:
      if (cVar6 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->aggregate_value_).ptr_;
        this_00 = &this->aggregate_value_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_00174f92;
        goto LAB_00174fa5;
      }
    }
    if ((uVar9 == 0) || ((uVar9 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
      ptr = (char *)p;
      goto LAB_00175069;
    }
    ptr = internal::UnknownFieldParse(uVar9,&this->_internal_metadata_,(char *)p,ctx);
LAB_00174fdd:
    if ((double *)ptr == (double *)0x0) {
LAB_00175066:
      ptr = (char *)(double *)0x0;
LAB_00175069:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar7;
      return (char *)(double *)ptr;
    }
  } while( true );
}

Assistant:

const char* UninterpretedOption::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_name(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string identifier_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_identifier_value(), ptr, ctx, "google.protobuf.UninterpretedOption.identifier_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 positive_int_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_positive_int_value(&has_bits);
          positive_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int64 negative_int_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_negative_int_value(&has_bits);
          negative_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional double double_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 49)) {
          _Internal::set_has_double_value(&has_bits);
          double_value_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // optional bytes string_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(_internal_mutable_string_value(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string aggregate_value = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_aggregate_value(), ptr, ctx, "google.protobuf.UninterpretedOption.aggregate_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}